

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::caddrinfo_get_new_bucket::test_method(caddrinfo_get_new_bucket *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  CService ipIn_03;
  CService ipIn_04;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  AddrInfo *pAVar7;
  iterator pvVar8;
  int *piVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  span<const_std::byte,_18446744073709551615UL> source;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff8dc;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffff8e0;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  undefined8 in_stack_fffffffffffff8e8;
  char *pcVar13;
  undefined1 in_stack_fffffffffffff8f0 [12];
  uint in_stack_fffffffffffff8fc;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  allocator<char> local_669;
  uint local_668;
  uint local_664;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  _Bvector_base<std::allocator<bool>_> local_540;
  NetGroupManager ngm_asmap;
  vector<bool,_std::allocator<bool>_> asmap;
  CService local_4c0;
  CService local_498;
  string local_470;
  direct_or_indirect local_450 [2];
  CService local_430;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  CService local_368;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count asStack_330 [5];
  AddrInfo infoi;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CService local_f8;
  CAddress addr2;
  CService local_98;
  CAddress addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  source._M_extent._M_extent_value = 0x3b;
  source._M_ptr = test::data::detail_asmap_raw;
  FromBytes(&asmap,source);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_540,&asmap);
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_540._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_540._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  local_540._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_540._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_540._M_impl.super__Bvector_impl_data._M_end_of_storage;
  local_540._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_540._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_540._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_540);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.2.1",(allocator<char> *)&info2);
  ResolveService(&local_98,(string *)&info1,0x208d);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffff8dc;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffff8d8;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff8e0;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff8e8;
  ipIn.super_CNetAddr.m_net = in_stack_fffffffffffff8f0._0_4_;
  ipIn.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8f0._4_4_;
  ipIn.port = in_stack_fffffffffffff8f0._8_2_;
  ipIn._34_2_ = in_stack_fffffffffffff8f0._10_2_;
  ipIn._36_4_ = in_stack_fffffffffffff8fc;
  CAddress::CAddress(&addr1,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  std::__cxx11::string::~string((string *)&info1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.2.1",(allocator<char> *)&info2);
  ResolveService(&local_f8,(string *)&info1,9999);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffff8dc;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffff8d8;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff8e0;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff8e8;
  ipIn_00.super_CNetAddr.m_net = in_stack_fffffffffffff8f0._0_4_;
  ipIn_00.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8f0._4_4_;
  ipIn_00.port = in_stack_fffffffffffff8f0._8_2_;
  ipIn_00._34_2_ = in_stack_fffffffffffff8f0._10_2_;
  ipIn_00._36_4_ = in_stack_fffffffffffff8fc;
  CAddress::CAddress(&addr2,ipIn_00,(ServiceFlags)&local_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  std::__cxx11::string::~string((string *)&info1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.2.1",(allocator<char> *)&info2);
  ResolveIP(&source1,(string *)&info1);
  std::__cxx11::string::~string((string *)&info1);
  AddrInfo::AddrInfo(&info1,&addr1,&source1);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  ser_writedata32<HashWriter>((HashWriter *)&info2,1);
  HashWriter::GetHash(&nKey1,(HashWriter *)&info2);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  ser_writedata32<HashWriter>((HashWriter *)&info2,2);
  HashWriter::GetHash(&nKey2,(HashWriter *)&info2);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x28c;
  file.m_begin = (iterator)&local_550;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_560,msg);
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_568 = "";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       AddrInfo::GetNewBucket(&info1,&nKey1,&ngm_asmap);
  pAVar7 = &infoi;
  bucket = 0x31b;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&info2,&local_570,0x28c,1,2,pAVar7,0xb4fd9b,&bucket,"795");
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pAVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = (iterator)0x28d;
  file_00.m_begin = (iterator)&local_580;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_590,
             msg_00);
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_598 = "";
  iVar3 = AddrInfo::GetNewBucket(&info1,&nKey1,&source1,&ngm_asmap);
  pAVar7 = &infoi;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ = iVar3;
  bucket = 0x31b;
  pvVar6 = (iterator)0x2;
  piVar9 = &bucket;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&info2,&local_5a0,0x28d,1,2,pAVar7,0xb4fdc0,&bucket,"795");
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pAVar7;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x291;
  file_01.m_begin = (iterator)&local_5b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_5c0,
             msg_01);
  iVar3 = AddrInfo::GetNewBucket(&info1,&nKey1,&ngm_asmap);
  iVar4 = AddrInfo::GetNewBucket(&info1,&nKey2,&ngm_asmap);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.direct[0] = iVar3 != iVar4;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  _bucket = "info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap)";
  local_338 = (long)"info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap)" +
              0x4c;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5c8 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = &bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&infoi,(lazy_ostream *)&info2,1,0,WARN,(check_type)piVar9,
             (size_t)&local_5d0,0x291);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size);
  AddrInfo::AddrInfo(&info2,&addr2,&source1);
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x295;
  file_02.m_begin = (iterator)&local_5e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5f0,
             msg_02);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&info1);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,
                   (CService *)&info2);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
  bucket._0_1_ = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  local_3a8._M_dataplus._M_p = "info1.GetKey() != info2.GetKey()";
  local_3a8._M_string_length = 0xb4fabe;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5f8 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,(check_type)piVar9,
             (size_t)&local_600,0x295);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
  this_00 = &buckets;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x296;
  file_03.m_begin = (iterator)&local_610;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_620,
             msg_03);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_628 = "";
  iVar3 = AddrInfo::GetNewBucket(&info1,&nKey1,&ngm_asmap);
  bucket = iVar3;
  buckets._M_t._M_impl._0_4_ = AddrInfo::GetNewBucket(&info2,&nKey1,&ngm_asmap);
  pcVar13 = "info2.GetNewBucket(nKey1, ngm_asmap)";
  uVar10 = 0xb4fd9b;
  uVar11 = 0;
  pvVar6 = (iterator)0x2;
  piVar9 = &bucket;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&infoi,&local_630,0x296,1);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (local_450[0]._0_4_ = 0; (int)local_450[0]._0_4_ < 0xff;
      local_450[0]._0_4_ = local_450[0]._0_4_ + 1) {
    util::ToString<int>(&local_3a8,(int *)local_450[0].direct);
    std::operator+(&local_388,"250.1.1.",&local_3a8);
    ResolveService(&local_368,&local_388,0);
    ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar11;
    ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar10;
    ipIn_01.super_CNetAddr.m_addr._union._8_8_ = this_00;
    ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar13;
    ipIn_01.super_CNetAddr.m_net = in_stack_fffffffffffff8f0._0_4_;
    ipIn_01.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8f0._4_4_;
    ipIn_01.port = in_stack_fffffffffffff8f0._8_2_;
    ipIn_01._34_2_ = in_stack_fffffffffffff8f0._10_2_;
    ipIn_01._36_4_ = in_stack_fffffffffffff8fc;
    CAddress::CAddress((CAddress *)&bucket,ipIn_01,(ServiceFlags)&local_368);
    util::ToString<int>(&local_408,(int *)local_450[0].direct);
    std::operator+(&local_3e8,"250.1.1.",&local_408);
    ResolveIP((CNetAddr *)&local_3c8,&local_3e8);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3c8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    iVar3 = AddrInfo::GetNewBucket(&infoi,&nKey1,&ngm_asmap);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoi);
  }
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)piVar9;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x2a2;
  file_04.m_begin = (iterator)&local_640;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_650,
             msg_04);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_658 = "";
  piVar9 = &bucket;
  _bucket = (char *)buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_388._M_dataplus._M_p._0_4_ = 1;
  pcVar13 = "1U";
  pbVar12 = &local_388;
  uVar10 = 0xcb7705;
  uVar11 = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&infoi,&local_660,0x2a2,1);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  uVar5 = 0;
  while (uVar5 != 0x3fc) {
    local_664 = (uint)(ushort)((short)((uVar5 & 0xffff) / 0xff) + 0xfa);
    util::ToString<int>(&local_3e8,(int *)&local_664);
    std::operator+(&local_3c8,&local_3e8,".");
    local_668 = uVar5 & 0xff;
    util::ToString<int>(&local_408,(int *)&local_668);
    std::operator+(&local_3a8,&local_3c8,&local_408);
    std::operator+(&local_388,&local_3a8,".1.1");
    ResolveService(&local_430,&local_388,0);
    ipIn_02.super_CNetAddr.m_addr._union._4_4_ = uVar11;
    ipIn_02.super_CNetAddr.m_addr._union._0_4_ = uVar10;
    ipIn_02.super_CNetAddr.m_addr._union._8_8_ = pbVar12;
    ipIn_02.super_CNetAddr.m_addr._16_8_ = pcVar13;
    ipIn_02.super_CNetAddr.m_net = in_stack_fffffffffffff8f0._0_4_;
    ipIn_02.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8f0._4_4_;
    ipIn_02.port = in_stack_fffffffffffff8f0._8_2_;
    ipIn_02._34_2_ = in_stack_fffffffffffff8f0._10_2_;
    ipIn_02._36_4_ = uVar5;
    CAddress::CAddress((CAddress *)&bucket,ipIn_02,(ServiceFlags)&local_430);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"251.4.1.1",&local_669);
    ResolveIP((CNetAddr *)&local_450[0].indirect_contents,&local_470);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_450[0].indirect_contents);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_450[0].indirect_contents);
    std::__cxx11::string::~string((string *)&local_470);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_430);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    iVar3 = AddrInfo::GetNewBucket(&infoi,&nKey1,&ngm_asmap);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    in_stack_fffffffffffff8fc = uVar5;
    AddrInfo::~AddrInfo(&infoi);
    uVar5 = in_stack_fffffffffffff8fc + 1;
  }
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)piVar9;
  msg_05.m_begin = pvVar6;
  file_05.m_end = (iterator)0x2af;
  file_05.m_begin = (iterator)&local_680;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_690,
             msg_05);
  bucket._0_1_ = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (buckets._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x41);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() <= 64";
  local_388._M_string_length = 0xb4fc59;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_388;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_698 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,(check_type)pbVar12,
             (size_t)&local_6a0,0x2af);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  for (local_450[0]._0_4_ = 0; (int)local_450[0]._0_4_ < 0xff;
      local_450[0]._0_4_ = local_450[0]._0_4_ + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"250.1.1.1",(allocator<char> *)&local_470);
    ResolveService(&local_498,&local_388,0);
    ipIn_03.super_CNetAddr.m_addr._union._4_4_ = uVar11;
    ipIn_03.super_CNetAddr.m_addr._union._0_4_ = uVar10;
    ipIn_03.super_CNetAddr.m_addr._union._8_8_ = pbVar12;
    ipIn_03.super_CNetAddr.m_addr._16_8_ = pcVar13;
    ipIn_03.super_CNetAddr.m_net = in_stack_fffffffffffff8f0._0_4_;
    ipIn_03.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8f0._4_4_;
    ipIn_03.port = in_stack_fffffffffffff8f0._8_2_;
    ipIn_03._34_2_ = in_stack_fffffffffffff8f0._10_2_;
    ipIn_03._36_4_ = in_stack_fffffffffffff8fc;
    CAddress::CAddress((CAddress *)&bucket,ipIn_03,(ServiceFlags)&local_498);
    util::ToString<int>(&local_408,(int *)local_450[0].direct);
    std::operator+(&local_3e8,"101.",&local_408);
    std::operator+(&local_3c8,&local_3e8,".1.1");
    ResolveIP((CNetAddr *)&local_3a8,&local_3c8);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_498);
    std::__cxx11::string::~string((string *)&local_388);
    iVar3 = AddrInfo::GetNewBucket(&infoi,&nKey1,&ngm_asmap);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoi);
  }
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar6;
  file_06.m_end = (iterator)0x2bb;
  file_06.m_begin = (iterator)&local_6b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_6c0,
             msg_06);
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_388;
  bucket._0_1_ = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (1 < buckets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() > 1";
  local_388._M_string_length = 0xb4fe72;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6c8 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,(check_type)pbVar12,
             (size_t)&local_6d0,699);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  for (local_450[0]._0_4_ = 0; (int)local_450[0]._0_4_ < 0xff;
      local_450[0]._0_4_ = local_450[0]._0_4_ + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"250.1.1.1",(allocator<char> *)&local_470);
    ResolveService(&local_4c0,&local_388,0);
    ipIn_04.super_CNetAddr.m_addr._union._4_4_ = uVar11;
    ipIn_04.super_CNetAddr.m_addr._union._0_4_ = uVar10;
    ipIn_04.super_CNetAddr.m_addr._union._8_8_ = pbVar12;
    ipIn_04.super_CNetAddr.m_addr._16_8_ = pcVar13;
    ipIn_04.super_CNetAddr.m_net = in_stack_fffffffffffff8f0._0_4_;
    ipIn_04.super_CNetAddr.m_scope_id = in_stack_fffffffffffff8f0._4_4_;
    ipIn_04.port = in_stack_fffffffffffff8f0._8_2_;
    ipIn_04._34_2_ = in_stack_fffffffffffff8f0._10_2_;
    ipIn_04._36_4_ = in_stack_fffffffffffff8fc;
    CAddress::CAddress((CAddress *)&bucket,ipIn_04,(ServiceFlags)&local_4c0);
    util::ToString<int>(&local_408,(int *)local_450[0].direct);
    std::operator+(&local_3e8,"250.",&local_408);
    std::operator+(&local_3c8,&local_3e8,".1.1");
    ResolveIP((CNetAddr *)&local_3a8,&local_3c8);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_388);
    iVar3 = AddrInfo::GetNewBucket(&infoi,&nKey1,&ngm_asmap);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoi);
  }
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar6;
  file_07.m_end = (iterator)0x2c7;
  file_07.m_begin = (iterator)&local_6e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_6f0,
             msg_07);
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_388;
  bucket._0_1_ = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 1);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() == 1";
  local_388._M_string_length = 0xb4fe86;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6f8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,(check_type)pbVar12,
             (size_t)&local_700,0x2c7);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&buckets._M_t);
  AddrInfo::~AddrInfo(&info2);
  AddrInfo::~AddrInfo(&info1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source1.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&ngm_asmap);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&asmap.super__Bvector_base<std::allocator<bool>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_new_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.2.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.2.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.2.1");

    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    // Test: Make sure the buckets are what we expect
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), 795);
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, source1, ngm_asmap), 795);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap));

    // Test: Ports should not affect bucket placement in the addr
    AddrInfo info2 = AddrInfo(addr2, source1);
    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), info2.GetNewBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix
    // usually map to the same bucket.
    BOOST_CHECK_EQUAL(buckets.size(), 1U);

    buckets.clear();
    for (int j = 0; j < 4 * 255; j++) {
        AddrInfo infoj = AddrInfo(CAddress(
                                        ResolveService(
                                            ToString(250 + (j / 255)) + "." + ToString(j % 256) + ".1.1"), NODE_NONE),
            ResolveIP("251.4.1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same source /16 prefix should not map to more
    // than 64 buckets.
    BOOST_CHECK(buckets.size() <= 64);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("101." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes usually map to MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() > 1);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("250." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes sometimes map to NO MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() == 1);
}